

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  long lVar2;
  undefined1 *puVar3;
  byte bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Head_base<0UL,_libtorrent::piece_picker_*,_false> this_00;
  pointer psVar6;
  counters *this_01;
  long lVar7;
  size_type *psVar8;
  undefined8 __n;
  int val;
  int iVar9;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar10;
  pointer psVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  stats_counter_t counter;
  torrent *this_02;
  byte *pbVar17;
  byte *__s;
  uint uVar18;
  message_type type;
  piece_index_t pVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  bool bVar20;
  span<const_char> buf;
  undefined8 uStack_90;
  char acStack_88 [8];
  size_type *local_80;
  string bitfield_string;
  long TORRENT_ALLOCA_size;
  
  this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_03 = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar9 = p_Var5->_M_use_count;
      do {
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar9 == 0) break;
        LOCK();
        iVar13 = p_Var5->_M_use_count;
        bVar20 = iVar9 == iVar13;
        if (bVar20) {
          p_Var5->_M_use_count = iVar9 + 1;
          iVar13 = iVar9;
        }
        iVar9 = iVar13;
        UNLOCK();
        this_03 = p_Var5;
      } while (!bVar20);
    }
  }
  if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_02 = (torrent *)0x0;
  }
  else if (this_03->_M_use_count == 0) {
    this_02 = (torrent *)0x0;
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar9 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar9 + -1;
    }
    if (iVar9 == 1) {
      uStack_90 = 0x22069c;
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  if ((this_02->field_0x5b0 & 8) != 0) {
    uStack_90 = 0x2206f8;
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    bVar4 = (this->super_peer_connection).field_0x765;
    if ((bVar4 & 4) != 0) {
      (this->super_peer_connection).field_0x765 = bVar4 | 8;
      uStack_90 = 0x220722;
      peer_connection::peer_log(&this->super_peer_connection,outgoing_message,"HAVE_NONE");
      uStack_90 = 0x220734;
      send_message<>(this,msg_have_none,num_outgoing_have_none);
    }
    puVar3 = &(this->super_peer_connection).field_0x765;
    *puVar3 = *puVar3 | 8;
    uStack_90 = 0x220745;
    ptVar10 = peer_connection::get_bitfield(&this->super_peer_connection);
    uStack_90 = 0x220750;
    pVar19 = torrent::get_piece_to_super_seed(this_02,ptVar10);
    if (-1 < pVar19.m_val) {
      uStack_90 = 0x220763;
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar19);
    }
    uStack_90 = 0x22076b;
    ptVar10 = peer_connection::get_bitfield(&this->super_peer_connection);
    uStack_90 = 0x220776;
    pVar19 = torrent::get_piece_to_super_seed(this_02,ptVar10);
    pcVar16 = acStack_88;
    if (-1 < pVar19.m_val) {
      uStack_90 = 0x22078d;
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar19);
      pcVar16 = acStack_88;
    }
    goto LAB_00220a51;
  }
  if (((this->super_peer_connection).field_0x765 & 4) == 0) {
LAB_00220792:
    if (((this->super_peer_connection).field_0x765 & 4) != 0) {
      uStack_90 = 0x2207a5;
      iVar9 = torrent::num_have(this_02);
      if (iVar9 == 0) {
        counter = num_outgoing_have_none;
        type = msg_have_none;
        pcVar16 = "HAVE_NONE";
        goto LAB_00220a2e;
      }
    }
    uStack_90 = 0x2207b5;
    iVar9 = torrent::num_have(this_02);
    if (iVar9 == 0) {
      uStack_90 = 0x220890;
      peer_connection::peer_log
                (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, have none");
      puVar3 = &(this->super_peer_connection).field_0x765;
      *puVar3 = *puVar3 | 8;
      pcVar16 = acStack_88;
    }
    else {
      iVar9 = (((this_02->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_num_pieces;
      iVar13 = iVar9 + 0xe;
      if (-1 < iVar9 + 7) {
        iVar13 = iVar9 + 7;
      }
      uVar18 = iVar13 >> 3;
      bitfield_string.field_2._8_8_ = SEXT48((int)uVar18);
      lVar2 = bitfield_string.field_2._8_8_ + 5;
      uVar15 = bitfield_string.field_2._8_8_ + 0x14 & 0xfffffffffffffff0;
      lVar7 = -uVar15;
      iVar13 = 0x18;
      __s = (byte *)(acStack_88 + (1 - uVar15));
      do {
        pbVar17 = __s;
        pbVar17[-1] = (byte)((int)(uVar18 + 1) >> ((byte)iVar13 & 0x1f));
        __s = pbVar17 + 1;
        iVar13 = iVar13 + -8;
      } while (iVar13 != -8);
      *pbVar17 = 5;
      *(undefined8 *)((long)&uStack_90 + lVar7) = 0x220839;
      bVar20 = torrent::is_seed(this_02);
      __n = bitfield_string.field_2._8_8_;
      if (bVar20) {
        if (0 < iVar9) {
          *(undefined8 *)((long)&uStack_90 + lVar7) = 0x220856;
          memset(__s,0xff,(ulong)uVar18);
        }
        acStack_88[lVar2 + lVar7 + -1] = (char)(0xff << (-(char)iVar9 & 7U));
      }
      else {
        pVar19.m_val = 0;
        *(undefined8 *)((long)&uStack_90 + lVar7) = 0x2208af;
        memset(__s,0,__n);
        if (0 < iVar9) {
          this_00._M_head_impl =
               (this_02->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::piece_picker,_std::default_delete<libtorrent::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::piece_picker_*,_std::default_delete<libtorrent::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::piece_picker_*,_false>._M_head_impl;
          uVar18 = 0x80;
          do {
            *(undefined8 *)((long)&uStack_90 + lVar7) = 0x2208cd;
            bVar20 = piece_picker::have_piece(this_00._M_head_impl,pVar19);
            if (bVar20) {
              *__s = *__s | (byte)uVar18;
            }
            __s = __s + (uVar18 < 2);
            bVar20 = uVar18 < 2;
            uVar18 = (int)uVar18 >> 1;
            if (bVar20) {
              uVar18 = 0x80;
            }
            pVar19.m_val = pVar19.m_val + 1;
          } while (iVar9 != pVar19.m_val);
        }
      }
      psVar6 = (this_02->m_predictive_pieces).
               super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar11 = (this_02->m_predictive_pieces).
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar6;
          psVar11 = psVar11 + 1) {
        iVar13 = psVar11->m_val;
        iVar14 = iVar13 + 7;
        if (-1 < iVar13) {
          iVar14 = iVar13;
        }
        acStack_88[(iVar14 >> 3) + lVar7 + 5] =
             acStack_88[(iVar14 >> 3) + lVar7 + 5] | (byte)(0x80 >> ((byte)iVar13 & 7));
      }
      *(undefined8 *)((long)&uStack_90 + lVar7) = 0x22094c;
      bVar20 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
      if (bVar20) {
        bitfield_string._M_dataplus._M_p = (pointer)0x0;
        bitfield_string._M_string_length._0_1_ = 0;
        local_80 = &bitfield_string._M_string_length;
        *(undefined8 *)((long)&uStack_90 + lVar7) = 0x22097a;
        std::__cxx11::string::resize((ulong)&local_80,(char)iVar9);
        psVar8 = local_80;
        if (iVar9 != 0) {
          lVar12 = 0;
          do {
            iVar13 = (int)lVar12;
            iVar14 = iVar13 + 7;
            if (-1 < iVar13) {
              iVar14 = iVar13;
            }
            *(byte *)((long)local_80 + lVar12) =
                 (byte)~(acStack_88[(iVar14 >> 3) + lVar7 + 5] << ((byte)lVar12 & 7)) >> 7 ^ 0x31;
            lVar12 = lVar12 + 1;
          } while (iVar9 != lVar12);
        }
        *(undefined8 *)((long)&uStack_90 + lVar7) = 0x2209d4;
        peer_connection::peer_log
                  (&this->super_peer_connection,outgoing_message,"BITFIELD","%s",psVar8);
        psVar8 = local_80;
        if (local_80 != &bitfield_string._M_string_length) {
          lVar12 = CONCAT71(bitfield_string._M_string_length._1_7_,
                            (undefined1)bitfield_string._M_string_length);
          *(undefined8 *)((long)&uStack_90 + lVar7) = 0x2209e9;
          operator_delete(psVar8,lVar12 + 1);
        }
      }
      puVar3 = &(this->super_peer_connection).field_0x765;
      *puVar3 = *puVar3 | 8;
      *(undefined8 *)((long)&uStack_90 + lVar7) = 0x220a00;
      buf.m_len = lVar2;
      buf.m_ptr = acStack_88 + lVar7;
      peer_connection::send_buffer(&this->super_peer_connection,buf);
      this_01 = (this->super_peer_connection).m_counters;
      *(undefined8 *)((long)&uStack_90 + lVar7) = 0x220a1a;
      counters::inc_stats_counter(this_01,0x5b,1);
      pcVar16 = acStack_88 + lVar7;
    }
  }
  else {
    uStack_90 = 0x2206bc;
    bVar20 = torrent::is_seed(this_02);
    if (!bVar20) goto LAB_00220792;
    counter = num_outgoing_have_all;
    type = msg_have_all;
    pcVar16 = "HAVE_ALL";
LAB_00220a2e:
    puVar3 = &(this->super_peer_connection).field_0x765;
    *puVar3 = *puVar3 | 8;
    uStack_90 = 0x220a44;
    peer_connection::peer_log(&this->super_peer_connection,outgoing_message,pcVar16);
    uStack_90 = 0x220a51;
    send_message<>(this,type,counter);
    pcVar16 = acStack_88;
  }
LAB_00220a51:
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    builtin_strncpy(pcVar16 + -8,"^\n\"",4);
    pcVar16[-4] = '\0';
    pcVar16[-3] = '\0';
    pcVar16[-2] = '\0';
    pcVar16[-1] = '\0';
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		detail::write_int32(packet_size - 4, ptr);
		detail::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			std::size_t const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}